

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O0

int x509_date_is_valid(mbedtls_x509_time *time)

{
  int iVar1;
  int ret;
  mbedtls_x509_time *time_local;
  
  if ((time->year < 0) || (9999 < time->year)) {
    return -0x2400;
  }
  if ((time->hour < 0) || (0x17 < time->hour)) {
    return -0x2400;
  }
  if ((time->min < 0) || (0x3b < time->min)) {
    return -0x2400;
  }
  if ((time->sec < 0) || (0x3b < time->sec)) {
    return -0x2400;
  }
  iVar1 = time->mon;
  if (iVar1 != 1) {
    if (iVar1 == 2) {
      if ((0 < time->day) && (time->day <= (int)((time->year % 4 == 0) + 0x1c))) {
        return 0;
      }
      return -0x2400;
    }
    if (iVar1 != 3) {
      if (iVar1 == 4) {
LAB_0013343a:
        if ((0 < time->day) && (time->day < 0x1f)) {
          return 0;
        }
        return -0x2400;
      }
      if (iVar1 != 5) {
        if (iVar1 == 6) goto LAB_0013343a;
        if (1 < iVar1 - 7U) {
          if (iVar1 == 9) goto LAB_0013343a;
          if (iVar1 != 10) {
            if (iVar1 == 0xb) goto LAB_0013343a;
            if (iVar1 != 0xc) {
              return -0x2400;
            }
          }
        }
      }
    }
  }
  if ((0 < time->day) && (time->day < 0x20)) {
    return 0;
  }
  return -0x2400;
}

Assistant:

static int x509_date_is_valid(const mbedtls_x509_time *time)
{
    int ret = MBEDTLS_ERR_X509_INVALID_DATE;

    CHECK_RANGE( 0, 9999, time->year );
    CHECK_RANGE( 0, 23,   time->hour );
    CHECK_RANGE( 0, 59,   time->min  );
    CHECK_RANGE( 0, 59,   time->sec  );

    switch( time->mon )
    {
        case 1: case 3: case 5: case 7: case 8: case 10: case 12:
            CHECK_RANGE( 1, 31, time->day );
            break;
        case 4: case 6: case 9: case 11:
            CHECK_RANGE( 1, 30, time->day );
            break;
        case 2:
            CHECK_RANGE( 1, 28 + (time->year % 4 == 0), time->day );
            break;
        default:
            return( ret );
    }

    return( 0 );
}